

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O2

vector<duckdb::LogicalType,_true> *
duckdb::ScalarFunctionExtractor::GetParameterLogicalTypes
          (vector<duckdb::LogicalType,_true> *__return_storage_ptr__,
          ScalarFunctionCatalogEntry *entry,idx_t offset)

{
  ScalarFunction fun;
  ScalarFunction local_130;
  
  FunctionSet<duckdb::ScalarFunction>::GetFunctionByOffset
            (&local_130,&(entry->functions).super_FunctionSet<duckdb::ScalarFunction>,offset);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&__return_storage_ptr__->
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &local_130.super_BaseScalarFunction.super_SimpleFunction.arguments.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ScalarFunction::~ScalarFunction(&local_130);
  return __return_storage_ptr__;
}

Assistant:

static vector<LogicalType> GetParameterLogicalTypes(ScalarFunctionCatalogEntry &entry, idx_t offset) {
		auto fun = entry.functions.GetFunctionByOffset(offset);
		return fun.arguments;
	}